

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

bool __thiscall duckdb::LineReader::NextLine(LineReader *this)

{
  bool bVar1;
  size_t __n;
  LineReader *in_RDI;
  bool found_next_newline;
  idx_t read_count;
  idx_t i;
  idx_t line_size;
  size_t in_stack_ffffffffffffffb8;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  idx_t local_20;
  long local_18;
  
  local_18 = 0;
  while( true ) {
    while( true ) {
      local_20 = GetNextNewline(in_RDI);
      __n = local_20 - in_RDI->position;
      if (0x32000 < local_18 + __n) break;
      memcpy(in_RDI->line_buffer + local_18,in_RDI->data_buffer + in_RDI->position,__n);
      local_18 = __n + local_18;
      if (local_20 < in_RDI->capacity) {
        *(undefined1 *)((long)in_RDI + local_18 + 0x10) = 0;
        in_RDI->position = local_20 + 1;
        if (in_RDI->data_buffer[local_20] == '\r') {
          SkipNewline((LineReader *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
        }
        if ((local_18 != 0) &&
           (bVar1 = Utf8Proc::IsValid((char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                       in_stack_ffffffffffffffc0),
                                      in_stack_ffffffffffffffb8), bVar1)) {
          return true;
        }
        local_18 = 0;
      }
      else {
        FillBuffer((LineReader *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
        if (in_RDI->capacity == 0) {
          return local_18 != 0;
        }
      }
    }
    bVar1 = false;
    while( true ) {
      in_stack_ffffffffffffffc7 = false;
      if (!bVar1) {
        in_stack_ffffffffffffffc7 = in_RDI->capacity != 0;
      }
      if ((bool)in_stack_ffffffffffffffc7 == false) break;
      local_20 = GetNextNewline(in_RDI);
      if (local_20 < in_RDI->capacity) {
        bVar1 = true;
      }
      if (!bVar1) {
        FillBuffer((LineReader *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      }
    }
    if (!bVar1) break;
    in_RDI->position = local_20 + 1;
    if (in_RDI->data_buffer[local_20] == '\r') {
      SkipNewline((LineReader *)(ulong)in_stack_ffffffffffffffc0);
    }
  }
  return false;
}

Assistant:

bool NextLine() {
		idx_t line_size = 0;
		while (true) {
			// find the next newline in the current buffer (if any)
			idx_t i = GetNextNewline();
			// copy over the data and move to the next byte
			idx_t read_count = i - position;
			if (line_size + read_count > LINENOISE_MAX_LINE) {
				// exceeded max line size
				// move on to next line and don't add to history
				// skip to next newline
				bool found_next_newline = false;
				while (!found_next_newline && capacity > 0) {
					i = GetNextNewline();
					if (i < capacity) {
						found_next_newline = true;
					}
					if (!found_next_newline) {
						// read more data
						FillBuffer();
					}
				}
				if (!found_next_newline) {
					// no newline found - skip
					return false;
				}
				// newline found - adjust position and read next line
				position = i + 1;
				if (data_buffer[i] == '\r') {
					// \r\n - skip the next byte as well
					SkipNewline();
				}
				continue;
			}
			memcpy(line_buffer + line_size, data_buffer + position, read_count);
			line_size += read_count;

			if (i < capacity) {
				// we're still within the buffer - this means we found a newline in the buffer
				line_buffer[line_size] = '\0';
				position = i + 1;
				if (data_buffer[i] == '\r') {
					// \r\n - skip the next byte as well
					SkipNewline();
				}
				if (line_size == 0 || !Utf8Proc::IsValid(line_buffer, line_size)) {
					// line is empty OR not valid UTF8
					// move on to next line and don't add to history
					line_size = 0;
					continue;
				}
				return true;
			}
			// we need to read more data - fill up the buffer
			FillBuffer();
			if (capacity == 0) {
				// no more data available - return true if there is anything we copied over (i.e. part of the next line)
				return line_size > 0;
			}
		}
	}